

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_thread_start(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread)

{
  undefined8 uVar1;
  sexp_conflict in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_conflict cell;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x24)) {
    (in_RCX->value).flonum_bits[0x60a4] = '\0';
    uVar1 = sexp_cons_op(in_RDI,0,2,in_RCX,0x23e);
    local_8 = in_RCX;
    if (((*(ulong *)(*(long *)(in_RDI + 0x28) + 0x168) & 3) == 0) &&
       (**(int **)(*(long *)(in_RDI + 0x28) + 0x168) == 6)) {
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x168) + 0x10) = uVar1;
      *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x168) = uVar1;
    }
    else {
      *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x160) = uVar1;
      *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x168) = uVar1;
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x24,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_thread_start (sexp ctx, sexp self, sexp_sint_t n, sexp thread) {
  sexp cell;
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  sexp_context_errorp(thread) = 0;
  cell = sexp_cons(ctx, thread, SEXP_NULL);
  if (sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
    sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = cell;
    sexp_global(ctx, SEXP_G_THREADS_BACK) = cell;
  } else {            /* init queue */
    sexp_global(ctx, SEXP_G_THREADS_BACK) = sexp_global(ctx, SEXP_G_THREADS_FRONT) = cell;
  }
  return thread;
}